

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

void __thiscall FrameProtector::FrameProtector(FrameProtector *this,char *name)

{
  Frame *this_00;
  Frame *frame;
  char *name_local;
  FrameProtector *this_local;
  
  if (g_frames == (Frame *)0x0) {
    __assert_fail("g_frames != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0x57,"FrameProtector::FrameProtector(const char *)");
  }
  if (g_current_frame != (Frame *)0x0) {
    this_00 = (Frame *)operator_new(0x40);
    Frame::Frame(this_00,name,g_current_frame);
    g_current_frame = this_00;
    this->protected_frame = this_00;
    return;
  }
  __assert_fail("g_current_frame != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0x58,"FrameProtector::FrameProtector(const char *)");
}

Assistant:

FrameProtector(const char *name) {
    assert(g_frames != nullptr);
    assert(g_current_frame != nullptr);
    Frame *frame = new Frame(name, g_current_frame);
    g_current_frame = frame;
    protected_frame = frame;
  }